

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O3

BtorSimBitVector * btorsim_bv_flipped_bit(BtorSimBitVector *bv,uint32_t pos)

{
  BtorSimBitVector *__dest;
  uint uVar1;
  uint uVar2;
  uint32_t i;
  uint uVar3;
  BtorSimBitVector *pBVar4;
  uint uVar5;
  
  pBVar4 = btorsim_bv_new(bv->width);
  __dest = pBVar4 + 1;
  memcpy(__dest,bv + 1,(ulong)bv->len << 2);
  uVar1 = pBVar4->len;
  uVar3 = ~(pos >> 5) + uVar1;
  uVar2 = (&pBVar4[1].width)[uVar3];
  uVar5 = uVar2 & ~(1 << (pos & 0x1f));
  if ((uVar2 >> (pos & 0x1f) & 1) == 0) {
    uVar5 = uVar2 | 1 << (pos & 0x1f);
  }
  (&pBVar4[1].width)[uVar3] = uVar5;
  if ((ulong)uVar1 << 5 != (ulong)pBVar4->width) {
    __dest->width = __dest->width & 0x7fffffffU >> (~(byte)pBVar4->width & 0x1f);
  }
  return pBVar4;
}

Assistant:

BtorSimBitVector *
btorsim_bv_flipped_bit (const BtorSimBitVector *bv, uint32_t pos)
{
  assert (bv);
  assert (bv->len > 0);
  assert (pos < bv->width);

  BtorSimBitVector *res;

  res = btorsim_bv_copy (bv);
  btorsim_bv_set_bit (res, pos, btorsim_bv_get_bit (res, pos) ? 0 : 1);
  set_rem_bits_to_zero (res);
  assert (rem_bits_zero_dbg (res));

  return res;
}